

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall spoa::Graph::Edge::AddSequence(Edge *this,uint32_t label,uint32_t w)

{
  iterator __position;
  uint local_14;
  
  __position._M_current =
       (this->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->labels,__position,
               &local_14);
  }
  else {
    *__position._M_current = label;
    (this->labels).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->weight = this->weight + (ulong)w;
  return;
}

Assistant:

void Graph::Edge::AddSequence(std::uint32_t label, std::uint32_t w) {
  labels.emplace_back(label);
  weight += w;
}